

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_LengthValue *
ON_LengthValue::Create
          (ON_LengthValue *__return_storage_ptr__,double length_value,
          LengthUnitSystem length_unit_system,uint locale_id,StringFormat string_format)

{
  ON_UnitSystem local_40;
  StringFormat local_21;
  uint local_20;
  StringFormat string_format_local;
  uint locale_id_local;
  LengthUnitSystem length_unit_system_local;
  double length_value_local;
  
  local_21 = string_format;
  local_20 = locale_id;
  string_format_local = length_unit_system;
  _locale_id_local = length_value;
  length_value_local = (double)__return_storage_ptr__;
  ON_UnitSystem::ON_UnitSystem(&local_40,length_unit_system);
  Create(__return_storage_ptr__,length_value,&local_40,local_20,local_21);
  ON_UnitSystem::~ON_UnitSystem(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::Create(
  double length_value,
  const ON::LengthUnitSystem length_unit_system,
  unsigned int locale_id,
  ON_LengthValue::StringFormat string_format
  //,  double clean_format_tolerance
)
{
  return ON_LengthValue::Create(
    length_value,
    ON_UnitSystem(length_unit_system),
    locale_id,
    string_format
    //,    clean_format_tolerance
  );
}